

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DateFormatSymbols::setWeekdays
          (DateFormatSymbols *this,UnicodeString *weekdaysArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  UMemory *this_00;
  long lVar3;
  long lVar4;
  UnicodeString **local_38;
  
  pUVar2 = weekdaysArray;
  if (context == STANDALONE) {
    switch(width) {
    case ABBREVIATED:
      local_38 = &this->fStandaloneShortWeekdays;
      pUVar1 = this->fStandaloneShortWeekdays;
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0xf0;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        goto LAB_002d07fe;
      }
      lVar4 = 0xf0;
      break;
    case WIDE:
      local_38 = &this->fStandaloneWeekdays;
      pUVar1 = this->fStandaloneWeekdays;
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0xe0;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        goto LAB_002d07fe;
      }
      lVar4 = 0xe0;
      break;
    case NARROW:
      local_38 = &this->fStandaloneNarrowWeekdays;
      pUVar1 = this->fStandaloneNarrowWeekdays;
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0x110;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        goto LAB_002d07fe;
      }
      lVar4 = 0x110;
      break;
    case SHORT:
      local_38 = &this->fStandaloneShorterWeekdays;
      pUVar1 = this->fStandaloneShorterWeekdays;
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0x100;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        goto LAB_002d07fe;
      }
      lVar4 = 0x100;
      break;
    default:
      goto switchD_002d054a_default;
    }
  }
  else {
    if (context != FORMAT) {
      return;
    }
    switch(width) {
    case ABBREVIATED:
      local_38 = &this->fShortWeekdays;
      pUVar1 = this->fShortWeekdays;
      if (pUVar1 == (UnicodeString *)0x0) {
        lVar4 = 0xb0;
      }
      else {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0xb0;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
LAB_002d07fe:
        UMemory::operator_delete__(this_00,pUVar2);
      }
      break;
    case WIDE:
      local_38 = &this->fWeekdays;
      pUVar1 = this->fWeekdays;
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0xa0;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        goto LAB_002d07fe;
      }
      lVar4 = 0xa0;
      break;
    case NARROW:
      local_38 = &this->fNarrowWeekdays;
      pUVar1 = this->fNarrowWeekdays;
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0xd0;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        goto LAB_002d07fe;
      }
      lVar4 = 0xd0;
      break;
    case SHORT:
      local_38 = &this->fShorterWeekdays;
      pUVar1 = this->fShorterWeekdays;
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        lVar4 = 0xc0;
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        goto LAB_002d07fe;
      }
      lVar4 = 0xc0;
      break;
    default:
      goto switchD_002d054a_default;
    }
  }
  pUVar2 = newUnicodeStringArray((long)count);
  *local_38 = pUVar2;
  uprv_arrayCopy(weekdaysArray,pUVar2,count);
  *(int32_t *)((long)&(this->super_UObject)._vptr_UObject + lVar4) = count;
switchD_002d054a_default:
  return;
}

Assistant:

void
DateFormatSymbols::setWeekdays(const UnicodeString* weekdaysArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fWeekdays)
                delete[] fWeekdays;
            fWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fWeekdays, count);
            fWeekdaysCount = count;
            break;
        case ABBREVIATED :
            if (fShortWeekdays)
                delete[] fShortWeekdays;
            fShortWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fShortWeekdays, count);
            fShortWeekdaysCount = count;
            break;
        case SHORT :
            if (fShorterWeekdays)
                delete[] fShorterWeekdays;
            fShorterWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fShorterWeekdays, count);
            fShorterWeekdaysCount = count;
            break;
        case NARROW :
            if (fNarrowWeekdays)
                delete[] fNarrowWeekdays;
            fNarrowWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fNarrowWeekdays, count);
            fNarrowWeekdaysCount = count;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneWeekdays)
                delete[] fStandaloneWeekdays;
            fStandaloneWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneWeekdays, count);
            fStandaloneWeekdaysCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortWeekdays)
                delete[] fStandaloneShortWeekdays;
            fStandaloneShortWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneShortWeekdays, count);
            fStandaloneShortWeekdaysCount = count;
            break;
        case SHORT :
            if (fStandaloneShorterWeekdays)
                delete[] fStandaloneShorterWeekdays;
            fStandaloneShorterWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneShorterWeekdays, count);
            fStandaloneShorterWeekdaysCount = count;
            break;
        case NARROW :
            if (fStandaloneNarrowWeekdays)
                delete[] fStandaloneNarrowWeekdays;
            fStandaloneNarrowWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneNarrowWeekdays, count);
            fStandaloneNarrowWeekdaysCount = count;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}